

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_test.cc
# Opt level: O1

UniquePtr<EC_GROUP> GetCurve(FileTest *t,char *key)

{
  bool bVar1;
  int iVar2;
  _Head_base<0UL,_FileTest::LineReader_*,_false> _Var3;
  string curve_name;
  AssertHelper local_70;
  string local_68;
  string local_48;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Curve","");
  bVar1 = FileTest::GetAttribute((FileTest *)key,&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    iVar2 = std::__cxx11::string::compare((char *)&local_48);
    if (iVar2 == 0) {
      _Var3._M_head_impl = (LineReader *)EC_group_p224();
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_48);
      if (iVar2 == 0) {
        _Var3._M_head_impl = (LineReader *)EC_group_p256();
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_48);
        if (iVar2 == 0) {
          _Var3._M_head_impl = (LineReader *)EC_group_p384();
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_48);
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)&local_48);
            if (iVar2 == 0) {
              NewSecp160r1Group();
              goto LAB_00304d9f;
            }
            testing::Message::Message((Message *)&local_68);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_68._M_dataplus._M_p + 0x10),"Unknown curve: ",0xf);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_68._M_dataplus._M_p + 0x10),local_48._M_dataplus._M_p,
                       local_48._M_string_length);
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                       ,0x136,"Failed");
            testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_68._M_dataplus._M_p + 8))();
            }
            goto LAB_00304d77;
          }
          _Var3._M_head_impl = (LineReader *)EC_group_p521();
        }
      }
    }
  }
  else {
LAB_00304d77:
    (t->reader_)._M_t.
    super___uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>._M_t.
    super__Tuple_impl<0UL,_FileTest::LineReader_*,_std::default_delete<FileTest::LineReader>_>.
    super__Head_base<0UL,_FileTest::LineReader_*,_false>._M_head_impl = (LineReader *)0x0;
    _Var3._M_head_impl = (LineReader *)0x0;
  }
  (t->reader_)._M_t.
  super___uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>._M_t.
  super__Tuple_impl<0UL,_FileTest::LineReader_*,_std::default_delete<FileTest::LineReader>_>.
  super__Head_base<0UL,_FileTest::LineReader_*,_false>._M_head_impl = _Var3._M_head_impl;
LAB_00304d9f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return (__uniq_ptr_data<ec_group_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ec_group_st,_bssl::internal::Deleter,_true,_true>)t;
}

Assistant:

static bssl::UniquePtr<EC_GROUP> GetCurve(FileTest *t, const char *key) {
  std::string curve_name;
  if (!t->GetAttribute(&curve_name, key)) {
    return nullptr;
  }

  if (curve_name == "P-224") {
    return bssl::UniquePtr<EC_GROUP>(const_cast<EC_GROUP *>(EC_group_p224()));
  }
  if (curve_name == "P-256") {
    return bssl::UniquePtr<EC_GROUP>(const_cast<EC_GROUP *>(EC_group_p256()));
  }
  if (curve_name == "P-384") {
    return bssl::UniquePtr<EC_GROUP>(const_cast<EC_GROUP *>(EC_group_p384()));
  }
  if (curve_name == "P-521") {
    return bssl::UniquePtr<EC_GROUP>(const_cast<EC_GROUP *>(EC_group_p521()));
  }
  if (curve_name == "secp160r1") {
    return NewSecp160r1Group();
  }

  ADD_FAILURE() << "Unknown curve: " << curve_name;
  return nullptr;
}